

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O3

gdImagePtr gdImageRotateInterpolated(gdImagePtr src,float angle,int bgcolor)

{
  gdImagePtr pgVar1;
  int iVar2;
  float fVar3;
  double dVar4;
  
  fVar3 = floorf(angle * 100.0);
  dVar4 = fmod((double)(int)fVar3,36000.0);
  if (-1 < bgcolor && src != (gdImagePtr)0x0) {
    iVar2 = (int)dVar4;
    if (src->trueColor == 0) {
      if ((uint)bgcolor < 0x100) {
        bgcolor = src->green[(uint)bgcolor] * 0x100 +
                  src->red[(uint)bgcolor] * 0x10000 + src->alpha[(uint)bgcolor] * 0x1000000 +
                  src->blue[(uint)bgcolor];
      }
      gdImagePaletteToTrueColor(src);
    }
    if (iVar2 < 0) {
      if (iVar2 == -27000) {
LAB_0011ab17:
        pgVar1 = gdImageRotate90(src,0);
        return pgVar1;
      }
      if (iVar2 == -18000) goto LAB_0011ab29;
      if (iVar2 == -9000) goto LAB_0011ab05;
    }
    else if (iVar2 < 18000) {
      if (iVar2 == 0) {
        pgVar1 = gdImageClone(src);
        if (pgVar1 == (gdImagePtr)0x0) {
          return (gdImagePtr)0x0;
        }
        if (pgVar1->trueColor == 0) {
          gdImagePaletteToTrueColor(pgVar1);
          return pgVar1;
        }
        return pgVar1;
      }
      if (iVar2 == 9000) goto LAB_0011ab17;
    }
    else {
      if (iVar2 == 18000) {
LAB_0011ab29:
        pgVar1 = gdImageRotate180(src,0);
        return pgVar1;
      }
      if (iVar2 == 27000) {
LAB_0011ab05:
        pgVar1 = gdImageRotate270(src,0);
        return pgVar1;
      }
    }
    if (0xffffffe8 < src->interpolation_id + ~GD_METHOD_COUNT) {
      if (src->interpolation_id != GD_NEAREST_NEIGHBOUR) {
        pgVar1 = gdImageRotateGeneric(src,angle,bgcolor);
        return pgVar1;
      }
      pgVar1 = gdImageRotateNearestNeighbour(src,angle,bgcolor);
      return pgVar1;
    }
  }
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageRotateInterpolated(const gdImagePtr src, const float angle, int bgcolor)
{
	/* round to two decimals and keep the 100x multiplication to use it in the common square angles 
	   case later. Keep the two decimal precisions so smaller rotation steps can be done, useful for
	   slow animations, f.e. */
	const int angle_rounded = fmod((int) floorf(angle * 100), 360 * 100);

	if (src == NULL || bgcolor < 0) {
		return NULL;
	}

	/* impact perf a bit, but not that much. Implementation for palette
	   images can be done at a later point.
	*/
	if (src->trueColor == 0) {
		if (bgcolor < gdMaxColors) {
			bgcolor =  gdTrueColorAlpha(src->red[bgcolor], src->green[bgcolor], src->blue[bgcolor], src->alpha[bgcolor]);
		}
		gdImagePaletteToTrueColor(src);
	}

	/* 0 && 90 degrees multiple rotation, 0 rotation simply clones the return image and convert it
	   to truecolor, as we must return truecolor image. */
	switch (angle_rounded) {
		case    0: {
			gdImagePtr dst = gdImageClone(src);

			if (dst == NULL) {
				return NULL;
			}
			if (dst->trueColor == 0) {
				gdImagePaletteToTrueColor(dst);
			}
			return dst;
		}

		case -27000:
		case   9000:
			return gdImageRotate90(src, 0);

		case -18000:
		case  18000:
			return gdImageRotate180(src, 0);

		case  -9000:
		case  27000:
			return gdImageRotate270(src, 0);
	}

	if (src->interpolation_id < 1 || src->interpolation_id > GD_METHOD_COUNT) {
		return NULL;
	}

	switch (src->interpolation_id) {
		case GD_NEAREST_NEIGHBOUR:
			return gdImageRotateNearestNeighbour(src, angle, bgcolor);
			break;

		case GD_BILINEAR_FIXED:
		case GD_BICUBIC_FIXED:
		default:
			return gdImageRotateGeneric(src, angle, bgcolor);
	}
	return NULL;
}